

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

FloatParts pick_nan(FloatParts a,FloatParts b,float_status *s)

{
  FloatParts a_00;
  _Bool _Var1;
  int iVar2;
  ulong uVar3;
  bool local_44;
  bool local_41;
  float_status *s_local;
  FloatParts b_local;
  FloatParts a_local;
  undefined8 local_10;
  
  uVar3 = b.frac;
  b_local._8_8_ = a.frac;
  a_local.frac._0_4_ = a.exp;
  a_local.frac._4_1_ = a.cls;
  a_local.frac._5_1_ = a.sign;
  a_local.frac._6_2_ = a._14_2_;
  _Var1 = is_snan(a_local.frac._4_1_);
  b_local.frac._4_1_ = b.cls;
  if ((_Var1) || (_Var1 = is_snan(b_local.frac._4_1_), _Var1)) {
    s->float_exception_flags = s->float_exception_flags | 1;
  }
  if (s->default_nan_mode == '\0') {
    local_41 = true;
    b_local.frac._5_1_ = b.sign;
    if ((ulong)b_local._8_8_ <= uVar3) {
      local_44 = b_local._8_8_ == uVar3 && (a_local.frac._5_1_ & 1) < (b_local.frac._5_1_ & 1U);
      local_41 = local_44;
    }
    iVar2 = pickNaN(a_local.frac._4_1_,b_local.frac._4_1_,local_41);
    if (iVar2 != 0) {
      a_local.frac._0_4_ = b.exp;
      a_local.frac._6_2_ = b._14_2_;
      b_local._8_8_ = uVar3;
      a_local.frac._4_1_ = b_local.frac._4_1_;
      a_local.frac._5_1_ = b_local.frac._5_1_;
    }
    _Var1 = is_snan(a_local.frac._4_1_);
    if (_Var1) {
      a_00.exp = (int32_t)a_local.frac;
      a_00.frac._0_4_ = b_local.exp;
      a_00.frac._4_1_ = b_local.cls;
      a_00.frac._5_1_ = b_local.sign;
      a_00.frac._6_2_ = b_local._14_2_;
      a_00.cls = a_local.frac._4_1_;
      a_00.sign = (_Bool)a_local.frac._5_1_;
      a_00._14_2_ = a_local.frac._6_2_;
      join_0x00000010_0x00000000_ = parts_silence_nan(a_00,s);
    }
    else {
      local_10._4_1_ = a_local.frac._4_1_;
      local_10._0_4_ = (int32_t)a_local.frac;
      local_10._5_1_ = (_Bool)a_local.frac._5_1_;
      local_10._6_2_ = a_local.frac._6_2_;
      a_local.exp = b_local.exp;
      a_local.cls = b_local.cls;
      a_local.sign = b_local.sign;
      a_local._14_2_ = b_local._14_2_;
    }
  }
  else {
    join_0x00000010_0x00000000_ = parts_default_nan(s);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

static FloatParts pick_nan(FloatParts a, FloatParts b, float_status *s)
{
    if (is_snan(a.cls) || is_snan(b.cls)) {
        s->float_exception_flags |= float_flag_invalid;
    }

    if (s->default_nan_mode) {
        return parts_default_nan(s);
    } else {
        if (pickNaN(a.cls, b.cls,
                    a.frac > b.frac ||
                    (a.frac == b.frac && a.sign < b.sign))) {
            a = b;
        }
        if (is_snan(a.cls)) {
            return parts_silence_nan(a, s);
        }
    }
    return a;
}